

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state,string_t x_data,
               hugeint_t y_data,AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  string_t new_value;
  
  lVar7 = y_data.upper;
  uVar5 = y_data.lower;
  new_value.value._0_8_ = x_data.value._8_8_;
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar6 = uVar5;
  if ((puVar1 != (unsigned_long *)0x0) &&
     (uVar6 = binary->ridx, (puVar1[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0)) {
    return;
  }
  lVar2 = (state->value).upper;
  uVar3 = (state->value).lower;
  bVar4 = uVar5 < uVar3;
  if ((lVar2 <= lVar7) && (bVar4 = bVar4 && lVar2 == lVar7, uVar3 <= uVar5 || lVar2 != lVar7)) {
    return;
  }
  uVar6 = CONCAT71((int7)(uVar6 >> 8),bVar4);
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    uVar6 = binary->lidx;
    bVar4 = (puVar1[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar4;
    if (bVar4) goto LAB_0189e317;
  }
  new_value.value.pointer.ptr = (char *)uVar6;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->arg,x_data.value._0_8_,new_value);
LAB_0189e317:
  (state->value).lower = uVar5;
  (state->value).upper = lVar7;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}